

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O1

tuple<unsigned_int,_int> __thiscall binary::binUvarint(binary *this,Bytes *buf)

{
  byte bVar1;
  pointer puVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  puVar2 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar4 != 0) {
    uVar8 = *(uint *)this;
    uVar7 = *(uint *)(this + 4);
    uVar5 = 0;
    uVar6 = 0;
    bVar3 = 0;
    do {
      bVar1 = puVar2[uVar5];
      if ((char)bVar1 < '\0') {
        uVar6 = uVar6 | (bVar1 & 0x7f) << (bVar3 & 0x1f);
        bVar3 = bVar3 + 7;
      }
      else if ((uVar5 < 9) || (bVar1 < 2)) {
        uVar7 = (uint)bVar1 << (bVar3 & 0x1f) | uVar6;
        uVar8 = (uint)uVar5 + 1;
      }
      else {
        uVar8 = ~(uint)uVar5;
        uVar7 = 0;
      }
      if (-1 < (char)bVar1) {
        *(uint *)(this + 4) = uVar7;
        *(uint *)this = uVar8;
        return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
      }
      uVar5 = uVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
    *(uint *)(this + 4) = uVar7;
  }
  *(undefined8 *)this = 0;
  return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
}

Assistant:

std::tuple<UInt, int> binUvarint(const Bytes &buf) {
	UInt x{};
	UInt s{};

	for (int i = 0; i < buf.size(); i++) {
		unsigned char b = buf.at(i);
		if (b < 0x80) {
			if (i >= 9 && b > 1) {
				return {0, -(i + 1)}; // overflow
			}
			return {x | UInt(b) << s, i + 1};
		}
		x |= UInt(b & 0x7f) << s;
		s += 7;
	}
	return {0, 0};
}